

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O1

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::modify_last
          (pod_bvector<agg::point_base<double>,_6U> *this,point_base<double> *val)

{
  double *pdVar1;
  double dVar2;
  uint nb;
  
  if (this->m_size != 0) {
    this->m_size = this->m_size - 1;
  }
  nb = this->m_size >> 6;
  if (this->m_num_blocks <= nb) {
    allocate_block(this,nb);
  }
  dVar2 = val->y;
  pdVar1 = (double *)((long)&this->m_blocks[nb]->x + (ulong)((this->m_size & 0x3f) << 4));
  *pdVar1 = val->x;
  pdVar1[1] = dVar2;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void pod_bvector<T, S>::modify_last(const T& val)
    {
        remove_last();
        add(val);
    }